

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
upb::generator::WriteMiniTableSourceIncludes
          (generator *this,FileDefPtr file,MiniTableOptions *options,Output *output)

{
  int iVar1;
  MiniTableOptions *pMVar2;
  int iVar3;
  char *pcVar4;
  undefined1 uVar5;
  Output *pOVar6;
  FileDefPtr file_00;
  char *extraout_RDX;
  FileDefPtr file_01;
  string_view filename;
  string_view filename_00;
  bool local_145;
  string_view local_120;
  string_view local_110;
  upb_FileDef *local_100;
  string local_f8;
  string_view local_d8;
  FileDefPtr local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  int local_ac;
  MiniTableOptions *pMStack_a8;
  int i;
  string local_a0;
  string_view local_80 [2];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string local_50;
  string_view local_30;
  MiniTableOptions *local_20;
  Output *output_local;
  MiniTableOptions *options_local;
  FileDefPtr file_local;
  
  local_20 = options;
  output_local = (Output *)file.ptr_;
  options_local = (MiniTableOptions *)this;
  pcVar4 = FileDefPtr::name((FileDefPtr *)&options_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,pcVar4);
  filename._M_str = (char *)output;
  filename._M_len = (size_t)local_60._M_str;
  FileWarning_abi_cxx11_(&local_50,(generator *)local_60._M_len,filename);
  uVar5 = SUB81(output,0);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  Output::operator()<>((Output *)options,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  pMVar2 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_80,
             "#include <stddef.h>\n#include \"upb/generated_code_support.h\"\n#include \"$0\"\n");
  pMStack_a8 = options_local;
  file_00.ptr_._0_4_ = (byte)(output_local->output_)._M_dataplus & 1;
  file_00.ptr_._4_4_ = 0;
  (anonymous_namespace)::HeaderFilename_abi_cxx11_
            (&local_a0,(_anonymous_namespace_ *)options_local,file_00,(bool)uVar5);
  Output::operator()((Output *)pMVar2,local_80[0],&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_ac = 0;
  while( true ) {
    iVar1 = local_ac;
    iVar3 = FileDefPtr::dependency_count((FileDefPtr *)&options_local);
    pMVar2 = local_20;
    if (iVar3 <= iVar1) break;
    local_145 = false;
    pOVar6 = output_local;
    if (((output_local->output_).field_0x2 & 1) != 0) {
      local_c8 = FileDefPtr::dependency((FileDefPtr *)&options_local,local_ac);
      pcVar4 = FileDefPtr::name(&local_c8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,pcVar4);
      filename_00._M_str = extraout_RDX;
      filename_00._M_len = (size_t)local_c0._M_str;
      local_145 = google::protobuf::compiler::IsKnownFeatureProto
                            ((compiler *)local_c0._M_len,filename_00);
    }
    pMVar2 = local_20;
    uVar5 = SUB81(pOVar6,0);
    if (local_145 == false) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d8,"#include \"$0\"\n");
      local_100 = (upb_FileDef *)FileDefPtr::dependency((FileDefPtr *)&options_local,local_ac);
      file_01.ptr_._0_4_ = (byte)(output_local->output_)._M_dataplus & 1;
      file_01.ptr_._4_4_ = 0;
      (anonymous_namespace)::HeaderFilename_abi_cxx11_
                (&local_f8,(_anonymous_namespace_ *)local_100,file_01,(bool)uVar5);
      Output::operator()((Output *)pMVar2,local_d8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    local_ac = local_ac + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_110,"\n// Must be last.\n#include \"upb/port/def.inc\"\n\n");
  Output::operator()<>((Output *)pMVar2,local_110);
  pMVar2 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_120,
             "extern const struct upb_MiniTable UPB_PRIVATE(_kUpb_MiniTable_StaticallyTreeShaken);\n"
            );
  Output::operator()<>((Output *)pMVar2,local_120);
  return;
}

Assistant:

void WriteMiniTableSourceIncludes(upb::FileDefPtr file,
                                  const MiniTableOptions& options,
                                  Output& output) {
  output(FileWarning(file.name()));

  output(
      "#include <stddef.h>\n"
      "#include \"upb/generated_code_support.h\"\n"
      "#include \"$0\"\n",
      HeaderFilename(file, options.bootstrap));

  for (int i = 0; i < file.dependency_count(); i++) {
    if (options.strip_nonfunctional_codegen &&
        google::protobuf::compiler::IsKnownFeatureProto(file.dependency(i).name())) {
      // Strip feature imports for editions codegen tests.
      continue;
    }
    output("#include \"$0\"\n",
           HeaderFilename(file.dependency(i), options.bootstrap));
  }

  output(
      "\n"
      "// Must be last.\n"
      "#include \"upb/port/def.inc\"\n"
      "\n");

  output(
      "extern const struct upb_MiniTable "
      "UPB_PRIVATE(_kUpb_MiniTable_StaticallyTreeShaken);\n");
}